

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UResourceBundle *
icu_63::TimeZone::loadRule
          (UResourceBundle *top,UnicodeString *ruleid,UResourceBundle *oldbundle,UErrorCode *status)

{
  UResourceBundle *pUVar1;
  char key [64];
  char acStack_68 [72];
  
  UnicodeString::extract(ruleid,0,0x3f,acStack_68,0x3f,kInvariant);
  pUVar1 = ures_getByKey_63(top,"Rules",oldbundle,status);
  pUVar1 = ures_getByKey_63(pUVar1,acStack_68,pUVar1,status);
  return pUVar1;
}

Assistant:

UResourceBundle* TimeZone::loadRule(const UResourceBundle* top, const UnicodeString& ruleid, UResourceBundle* oldbundle, UErrorCode& status) {
    char key[64];
    ruleid.extract(0, sizeof(key)-1, key, (int32_t)sizeof(key)-1, US_INV);
    U_DEBUG_TZ_MSG(("loadRule(%s)\n", key));
    UResourceBundle *r = ures_getByKey(top, kRULES, oldbundle, &status);
    U_DEBUG_TZ_MSG(("loadRule(%s) -> kRULES [%s]\n", key, u_errorName(status)));
    r = ures_getByKey(r, key, r, &status);
    U_DEBUG_TZ_MSG(("loadRule(%s) -> item [%s]\n", key, u_errorName(status)));
    return r;
}